

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# publisher_link.cpp
# Opt level: O2

void __thiscall
miniros::PublisherLink::PublisherLink
          (PublisherLink *this,SubscriptionPtr *parent,string *xmlrpc_uri,
          TransportHints *transport_hints)

{
  (this->super_enable_shared_from_this<miniros::PublisherLink>)._M_weak_this.
  super___weak_ptr<miniros::PublisherLink,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  (this->super_enable_shared_from_this<miniros::PublisherLink>)._M_weak_this.
  super___weak_ptr<miniros::PublisherLink,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  this->_vptr_PublisherLink = (_func_int **)&PTR__PublisherLink_002f10d0;
  std::__weak_ptr<miniros::Subscription,(__gnu_cxx::_Lock_policy)2>::
  __weak_ptr<miniros::Subscription,void>
            ((__weak_ptr<miniros::Subscription,(__gnu_cxx::_Lock_policy)2> *)&this->parent_,
             &parent->super___shared_ptr<miniros::Subscription,_(__gnu_cxx::_Lock_policy)2>);
  this->connection_id_ = 0;
  std::__cxx11::string::string((string *)&this->publisher_xmlrpc_uri_,(string *)xmlrpc_uri);
  (this->stats_).bytes_received_ = 0;
  (this->stats_).messages_received_ = 0;
  (this->stats_).drops_ = 0;
  TransportHints::TransportHints(&this->transport_hints_,transport_hints);
  this->latched_ = false;
  (this->caller_id_)._M_dataplus._M_p = (pointer)&(this->caller_id_).field_2;
  (this->caller_id_)._M_string_length = 0;
  (this->caller_id_).field_2._M_local_buf[0] = '\0';
  Header::Header(&this->header_);
  (this->md5sum_)._M_dataplus._M_p = (pointer)&(this->md5sum_).field_2;
  (this->md5sum_)._M_string_length = 0;
  (this->md5sum_).field_2._M_local_buf[0] = '\0';
  return;
}

Assistant:

PublisherLink::PublisherLink(const SubscriptionPtr& parent, const std::string& xmlrpc_uri, 
			     const TransportHints& transport_hints)
: parent_(parent)
, connection_id_(0)
, publisher_xmlrpc_uri_(xmlrpc_uri)
, transport_hints_(transport_hints)
, latched_(false)
{ }